

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

char * __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<false>
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,uint pageCount)

{
  PageBitVector *this_00;
  PageAllocatorBaseCommon *pPVar1;
  HANDLE pVVar2;
  code *pcVar3;
  bool bVar4;
  BOOLEAN BVar5;
  BVIndex BVar6;
  uint uVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  char *lpAddress;
  HANDLE pVVar10;
  AllocatorType *pAVar11;
  BVIndex BVar12;
  uintptr_t mask;
  DWORD local_44;
  undefined4 *puStack_40;
  DWORD oldProtect;
  char *local_38;
  
  BVar12 = this->freePageCount;
  if (BVar12 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x152,"(freePageCount != 0)","freePageCount != 0");
    if (!bVar4) goto LAB_006785e0;
    *puVar9 = 0;
    BVar12 = this->freePageCount;
  }
  this_00 = &this->freePages;
  BVar6 = BVStatic<272UL>::Count(this_00);
  if (BVar12 != BVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x153,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar4) goto LAB_006785e0;
    *puVar9 = 0;
  }
  if (this->freePageCount < pageCount) {
LAB_006782dd:
    local_38 = (char *)0x0;
  }
  else {
    bVar4 = IsFull(this);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x158,"(!IsFull())","!IsFull()");
      if (!bVar4) {
LAB_006785e0:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
      puStack_40 = puVar9;
    }
    else {
      puStack_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    }
    local_38 = (char *)0x0;
    BVar6 = BVStatic<272UL>::GetNextBit(this_00,0);
    for (BVar12 = BVar6; BVar12 != 0xffffffff; BVar12 = BVStatic<272UL>::GetNextBit(this_00,BVar12))
    {
      pPVar1 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
               allocator;
      pAVar11 = &pPVar1[-1].allocatorType;
      if (pPVar1 == (PageAllocatorBaseCommon *)0x0) {
        pAVar11 = (AllocatorType *)0x0;
      }
      if (pAVar11[0x28] <= BVar12) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = puStack_40;
        *puStack_40 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x15d,"(index < this->GetAllocator()->GetMaxAllocPageCount())",
                           "index < this->GetAllocator()->GetMaxAllocPageCount()");
        if (!bVar4) goto LAB_006785e0;
        *puVar9 = 0;
      }
      uVar7 = GetAvailablePageCount(this);
      if (uVar7 - BVar12 < pageCount) {
        return local_38;
      }
      if (pageCount == 1) {
        lpAddress = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address + (BVar6 << 0xc);
        BVar12 = BVar6;
LAB_00678499:
        BVStatic<272UL>::ClearRange(this_00,BVar12,pageCount);
        BVar6 = this->freePageCount - pageCount;
        this->freePageCount = BVar6;
        BVar12 = BVStatic<272UL>::Count(this_00);
        puVar9 = puStack_40;
        if (BVar6 != BVar12) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x177,"(freePageCount == (uint)this->GetCountOfFreePages())",
                             "freePageCount == (uint)this->GetCountOfFreePages()");
          if (!bVar4) goto LAB_006785e0;
          *puVar9 = 0;
        }
        pPVar1 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                 allocator;
        pAVar11 = &pPVar1[-1].allocatorType;
        if (pPVar1 == (PageAllocatorBaseCommon *)0x0) {
          pAVar11 = (AllocatorType *)0x0;
        }
        pVVar2 = *(HANDLE *)(pAVar11 + 0x4a);
        pVVar10 = GetCurrentProcess();
        if (pVVar2 != pVVar10) {
          return lpAddress;
        }
        BVar8 = VirtualProtect(lpAddress,(ulong)(pageCount << 0xc),4,&local_44);
        if (BVar8 != 0) {
          if (local_44 == 1) {
            return lpAddress;
          }
          AssertCount = AssertCount + 1;
          local_38 = lpAddress;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x183,"(oldProtect == 0x01)","oldProtect == PAGE_NOACCESS");
          if (bVar4) {
            *puVar9 = 0;
            return local_38;
          }
          goto LAB_006785e0;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x180,"((0))","UNREACHED");
        if (!bVar4) goto LAB_006785e0;
        *puVar9 = 0;
        goto LAB_006782dd;
      }
      BVar5 = BVStatic<272UL>::TestRange(this_00,BVar12,pageCount);
      if (BVar5 == '\0') {
        BVar12 = BVar12 + 1;
      }
      else {
        lpAddress = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address + (BVar12 << 0xc)
        ;
        if ((pageCount == 0) || (((ulong)pageCount * 0x1000 - 1 & (ulong)lpAddress) == 0))
        goto LAB_00678499;
        BVar12 = BVar12 + (int)((ulong)lpAddress % ((ulong)pageCount * 0x1000) >> 0xc);
        pPVar1 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                 allocator;
        pAVar11 = &pPVar1[-1].allocatorType;
        if (pPVar1 == (PageAllocatorBaseCommon *)0x0) {
          pAVar11 = (AllocatorType *)0x0;
        }
        if (pAVar11[0x28] <= BVar12) {
          return local_38;
        }
      }
    }
  }
  return local_38;
}

Assistant:

char *
PageSegmentBase<T>::AllocPages(uint pageCount)
{
    Assert(freePageCount != 0);
    Assert(freePageCount == (uint)this->GetCountOfFreePages());
    if (freePageCount < pageCount)
    {
        return nullptr;
    }
    Assert(!IsFull());

    uint index = this->GetNextBitInFreePagesBitVector(0);
    while (index != -1)
    {
        Assert(index < this->GetAllocator()->GetMaxAllocPageCount());

        if (GetAvailablePageCount() - index < pageCount)
        {
            break;
        }
        if (pageCount == 1 || this->TestRangeInFreePagesBitVector(index, pageCount))
        {
            char * allocAddress = this->address + index * AutoSystemInfo::PageSize;

            if (pageCount > 1 && !notPageAligned)
            {
                uint nextIndex = 0;
                if (!IsAllocationPageAligned(allocAddress, pageCount, &nextIndex))
                {
                    if (index + nextIndex >= this->GetAllocator()->GetMaxAllocPageCount())
                    {
                        return nullptr;
                    }
                    index = this->freePages.GetNextBit(index + nextIndex);
                    continue;
                }
            }

            this->ClearRangeInFreePagesBitVector(index, pageCount);
            freePageCount -= pageCount;
            Assert(freePageCount == (uint)this->GetCountOfFreePages());

#ifdef PAGEALLOCATOR_PROTECT_FREEPAGE
            if (this->GetAllocator()->processHandle == GetCurrentProcess())
            {
                DWORD oldProtect;
                BOOL vpresult = VirtualProtect(allocAddress, pageCount * AutoSystemInfo::PageSize, PAGE_READWRITE, &oldProtect);
                if (vpresult == FALSE)
                {
                    Assert(UNREACHED);
                    return nullptr;
                }
                Assert(oldProtect == PAGE_NOACCESS);
            }
#endif
            return allocAddress;
        }
        index = this->GetNextBitInFreePagesBitVector(index + 1);
    }
    return nullptr;
}